

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

MPP_RET __thiscall Mpp::put_frame_async(Mpp *this,MppFrame frame)

{
  int iVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  pthread_mutex_t *__mutex;
  MppFrame local_18;
  
  MVar3 = MPP_NOK;
  if ((pthread_mutex_t *)this->mFrmIn != (pthread_mutex_t *)0x0) {
    local_18 = frame;
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)this->mFrmIn);
    if (iVar1 == 0) {
      MVar2 = mpp_list::wait_le(this->mFrmIn,10,1);
      __mutex = (pthread_mutex_t *)this->mFrmIn;
      MVar3 = MPP_NOK;
      if (MVar2 == MPP_OK) {
        mpp_list::add_at_tail((mpp_list *)&__mutex->__data,&local_18,8);
        this->mFramePutCount = this->mFramePutCount + 1;
        notify(this,1);
        __mutex = (pthread_mutex_t *)this->mFrmIn;
        MVar3 = MPP_OK;
      }
      pthread_mutex_unlock(__mutex);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET Mpp::put_frame_async(MppFrame frame)
{
    if (NULL == mFrmIn)
        return MPP_NOK;

    if (mFrmIn->trylock())
        return MPP_NOK;

    /* NOTE: the max input queue length is 2 */
    if (mFrmIn->wait_le(10, 1)) {
        mFrmIn->unlock();
        return MPP_NOK;
    }

    mFrmIn->add_at_tail(&frame, sizeof(frame));
    mFramePutCount++;

    notify(MPP_INPUT_ENQUEUE);
    mFrmIn->unlock();

    return MPP_OK;
}